

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O3

optional<tinyusdz::Prim> *
tinyusdz::detail::ReconstructPrimFromPrimSpec
          (optional<tinyusdz::Prim> *__return_storage_ptr__,PrimSpec *primspec,string *warn,
          string *err)

{
  string *psVar1;
  size_type sVar2;
  int *piVar3;
  long *plVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  GeomMesh *pGVar9;
  optional<tinyusdz::Prim> *extraout_RAX;
  optional<tinyusdz::Prim> *extraout_RAX_00;
  optional<tinyusdz::Prim> *extraout_RAX_01;
  optional<tinyusdz::Prim> *poVar10;
  ostream *poVar11;
  optional<tinyusdz::Prim> *extraout_RAX_02;
  optional<tinyusdz::Prim> *extraout_RAX_03;
  optional<tinyusdz::Prim> *extraout_RAX_04;
  optional<tinyusdz::Prim> *extraout_RAX_05;
  optional<tinyusdz::Prim> *extraout_RAX_06;
  optional<tinyusdz::Prim> *extraout_RAX_07;
  optional<tinyusdz::Prim> *extraout_RAX_08;
  optional<tinyusdz::Prim> *extraout_RAX_09;
  optional<tinyusdz::Prim> *extraout_RAX_10;
  optional<tinyusdz::Prim> *extraout_RAX_11;
  optional<tinyusdz::Prim> *extraout_RAX_12;
  optional<tinyusdz::Prim> *extraout_RAX_13;
  optional<tinyusdz::Prim> *extraout_RAX_14;
  optional<tinyusdz::Prim> *extraout_RAX_15;
  optional<tinyusdz::Prim> *extraout_RAX_16;
  optional<tinyusdz::Prim> *extraout_RAX_17;
  optional<tinyusdz::Prim> *extraout_RAX_18;
  optional<tinyusdz::Prim> *extraout_RAX_19;
  optional<tinyusdz::Prim> *extraout_RAX_20;
  optional<tinyusdz::Prim> *extraout_RAX_21;
  Prim prim;
  Scope typed_prim;
  storage_union local_4d30;
  undefined1 local_4d20 [32];
  string *local_4d00;
  undefined1 local_4cf8 [624];
  string local_4a88 [224];
  undefined1 local_49a8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4998;
  undefined1 local_4978 [32];
  undefined1 local_4958 [32];
  ios_base local_4938 [48];
  string local_4908 [32];
  storage_t<double> local_48e8 [5];
  string local_48c0 [632];
  undefined1 local_4648 [784];
  undefined1 local_4338 [336];
  undefined1 local_41e8 [456];
  undefined1 local_4020 [40];
  undefined1 local_3ff8 [16];
  undefined1 local_3fe8 [24];
  undefined1 local_3fd0 [16];
  undefined1 local_3fc0 [16];
  Specifier local_3fb0;
  undefined4 uStack_3fac;
  undefined8 local_3fa8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3fa0;
  undefined1 local_3f90 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f80;
  undefined8 local_3f70;
  undefined1 local_3f68 [24];
  storage_t<double> local_3f50;
  undefined1 local_3f48 [16];
  undefined1 local_3f38 [8];
  undefined1 auStack_3f30 [24];
  undefined1 local_3f18 [16];
  undefined1 auStack_3f08 [24];
  undefined1 local_3ef0 [32];
  undefined1 auStack_3ed0 [16];
  undefined1 auStack_3ec0 [32];
  undefined1 local_3ea0 [16];
  undefined1 local_3e90 [32];
  undefined1 local_3e70 [16];
  undefined1 auStack_3e60 [16];
  undefined1 auStack_3e50 [16];
  undefined1 local_3e40 [32];
  undefined1 local_3e20 [16];
  undefined1 local_3e10 [16];
  undefined1 local_3e00 [16];
  undefined1 local_3df0 [24];
  undefined1 auStack_3dd8 [16];
  undefined1 local_3dc8 [16];
  undefined1 local_3db8 [24];
  undefined1 local_3da0 [16];
  undefined1 local_3d90 [24];
  undefined1 local_3d78 [16];
  undefined1 local_3d68 [16];
  undefined1 local_3d58 [16];
  undefined1 auStack_3d48 [16];
  undefined1 auStack_3d38 [16];
  undefined1 local_3d28 [16];
  undefined1 local_3d18 [16];
  undefined1 local_3d08 [32];
  undefined1 auStack_3ce8 [16];
  undefined1 auStack_3cd8 [16];
  undefined1 local_3cc8 [24];
  undefined1 auStack_3cb0 [16];
  undefined1 local_3ca0 [24];
  undefined1 auStack_3c88 [32];
  undefined1 local_3c68 [32];
  undefined1 local_3c48 [16];
  undefined1 local_3c38 [32];
  undefined1 local_3c18 [16];
  undefined1 auStack_3c08 [32];
  undefined1 local_3be8 [24];
  undefined1 auStack_3bd0 [16];
  storage_t<std::pair<tinyusdz::ListEditQual,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  sStack_3bc0;
  undefined1 auStack_3ba0 [40];
  undefined1 auStack_3b78 [24];
  undefined1 local_3b60 [32];
  undefined1 local_3b40 [24];
  undefined1 local_3b28 [16];
  undefined1 auStack_3b18 [16];
  undefined1 auStack_3b08 [176];
  PrimMetas local_3a58 [2];
  undefined1 local_31a0 [704];
  undefined1 local_2ee0 [11952];
  
  psVar1 = &primspec->_typeName;
  iVar8 = ::std::__cxx11::string::compare((char *)psVar1);
  local_4d20._16_8_ = __return_storage_ptr__;
  local_4d20._24_8_ = psVar1;
  local_4d00 = warn;
  if (iVar8 == 0) {
    local_4978._0_8_ = &local_4998.field_2;
    local_49a8._0_8_ = (pointer)0x0;
    local_49a8._8_8_ = (pointer)0x0;
    local_4998._M_dataplus._M_p._0_4_ = 0;
    local_4998._M_dataplus._M_p._4_1_ = '\0';
    local_4998._M_dataplus._M_p._5_1_ = '\0';
    local_4998._M_dataplus._M_p._6_1_ = '\0';
    local_4998._M_dataplus._M_p._7_1_ = '\0';
    local_4998.field_2._M_allocated_capacity._0_4_ = 0;
    local_4998.field_2._8_8_ = 0;
    local_4978._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_4978[0x18] = false;
    local_4978._8_8_ = local_4978._0_8_;
    memset(local_4338,0,0x308);
    local_41e8._448_4_ = _S_red;
    local_4020._0_8_ = (_Base_ptr)0x0;
    memset(local_4958,0,0x309);
    memset(local_4648,0,0x309);
    local_4020._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3fe8._0_8_ = local_3ff8;
    local_3ff8._0_4_ = _S_red;
    local_3ff8._8_8_ = (_Base_ptr)0x0;
    local_3fe8[0x10] = false;
    local_3fe8._17_3_ = 0;
    local_3fe8._20_4_ = (storage_t<unsigned_int>)0x0;
    local_3fd0._0_8_ = local_3fc0;
    local_3fd0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3fc0[0] = '\0';
    _local_3fb0 = &local_3fa0;
    local_3fa8 = 0;
    local_3fa0._M_local_buf[0] = false;
    local_3f90._0_4_ = _S_red;
    local_3f90._8_8_ = 0xffffffffffffffff;
    local_3f80._8_4_ = 0;
    local_3f70 = local_3f68 + 8;
    local_3f80._M_allocated_capacity._0_4_ = 0;
    local_3f80._M_local_buf[4] = '\0';
    local_3f68._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3f68[8] = '\0';
    local_3f50._0_1_ = 0;
    local_3e10[8] = 0;
    local_3ca0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3ca0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3ca0._16_8_ = (_Base_ptr)0x0;
    auStack_3c88._0_8_ = (_Base_ptr)0x0;
    local_3c68._0_8_ = (long)auStack_3c88 + 0x10;
    auStack_3c88._16_4_ = _S_red;
    auStack_3c88._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3f48._0_8_ = 0;
    local_3f48._8_8_ = 0;
    local_3f38 = (undefined1  [8])0x0;
    auStack_3f30._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3f30._8_8_ = 0;
    auStack_3f30._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3f18[0] = 0;
    local_3f18._8_8_ = 0;
    auStack_3f08._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3f08._8_8_ = 0;
    auStack_3f08._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3ef0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3ef0._8_8_ = 0;
    local_3ef0[0x10] = 0;
    local_3ef0._24_8_ = 0;
    auStack_3ed0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3ed0._8_8_ = 0;
    auStack_3ec0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3ec0._8_8_ = 0;
    auStack_3ec0._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3ec0[0x18] = 0;
    local_3e70[0] = 0;
    local_3e90._16_8_ = 0;
    local_3e90._24_8_ = 0;
    local_3e90._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3e90._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3ea0._0_8_ = 0;
    local_3ea0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3e50[8] = 0;
    auStack_3e60._8_8_ = 0;
    auStack_3e50._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3e70._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3e60._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3e20._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3e20._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3e40._16_8_ = 0;
    local_3e40._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3e40._0_8_ = 0;
    local_3e40._8_8_ = 0;
    local_3e10._0_2_ = 0;
    auStack_3dd8[8] = 0;
    local_3df0._16_8_ = 0;
    auStack_3dd8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3df0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3df0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3e00._0_8_ = 0;
    local_3e00._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3db8[0x10] = 0;
    local_3db8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3db8._8_8_ = 0;
    local_3dc8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3dc8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d90[0x10] = 0;
    local_3d90._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d90._8_8_ = 0;
    local_3da0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3da0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d58[0] = 0;
    local_3d68._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d68._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d78._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d78._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3d38[8] = 0;
    auStack_3d48._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3d38._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d58._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3d48._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d08[0x10] = 0;
    local_3d08._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d08._8_8_ = 0;
    local_3d18._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d18._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d28._0_8_ = 0;
    local_3d28._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3cd8[8] = 0;
    auStack_3ce8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3cd8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d08._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3ce8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3cb0[8] = 0;
    local_3cc8._16_8_ = 0;
    auStack_3cb0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3cc8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3cc8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3c68._16_8_ = (_Base_ptr)0x0;
    local_3c38._0_8_ = local_3c48;
    local_3c48._0_4_ = _S_red;
    local_3c48._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3c08[0x10] = 0;
    auStack_3c08._17_8_ = 0;
    auStack_3c08._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3c08[8] = 0;
    auStack_3c08._9_7_ = 0;
    local_3c18._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3c18._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3c38._16_8_ = (pointer)0x0;
    local_3c38._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3bd0[8] = false;
    local_3be8._16_8_ = 0;
    auStack_3bd0._0_8_ = 0;
    local_3be8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3be8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    sStack_3bc0._16_1_ = 0;
    sStack_3bc0._17_8_ = 0;
    sStack_3bc0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    sStack_3bc0._8_1_ = 0;
    sStack_3bc0._9_7_ = 0;
    local_3b60._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3b60._0_8_ = 0;
    local_3b60._8_8_ = (pointer)0x0;
    local_3b40._16_8_ = local_3b40;
    local_3b40._0_4_ = 0;
    local_3b40._8_8_ = 0;
    auStack_3ba0._16_4_ = 0;
    auStack_3ba0._20_8_ = 0;
    auStack_3ba0[0] = false;
    auStack_3ba0._1_3_ = 0;
    auStack_3ba0._4_4_ = (storage_t<unsigned_int>)0x0;
    auStack_3ba0._8_4_ = 0;
    auStack_3ba0._12_4_ = 0;
    auStack_3b78._8_4_ = 0;
    auStack_3b78._12_8_ = 0;
    auStack_3ba0._32_8_ = 0;
    auStack_3b78._0_4_ = 0;
    auStack_3b78._4_4_ = 0;
    auStack_3b08._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3b08._8_8_ = 0;
    auStack_3b08._16_8_ = 0;
    auStack_3b18._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3b08._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3b28._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3b18._0_8_ = (storage_t<double>)0x0;
    local_4cf8[0] = false;
    local_4020._8_8_ = (_Base_ptr)(local_41e8 + 0x1c0);
    local_4020._16_8_ = (_Base_ptr)(local_41e8 + 0x1c0);
    local_3fe8._8_8_ = local_3fe8._0_8_;
    local_3c68._8_8_ = local_3c68._0_8_;
    local_3c38._8_8_ = local_3c38._0_8_;
    local_3b28._0_8_ = local_3b40._16_8_;
    bVar7 = tinyusdz::prim::ReconstructPrim<tinyusdz::Model>
                      (primspec,(Model *)local_49a8,local_4d00,err,
                       (PrimReconstructOptions *)local_4cf8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                 ,0x55);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,"ReconstructPrimFromPrimSpec",0x1b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
      poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x47c);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,"Failed to reconstruct Model",0x1b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"\n",1);
      poVar10 = (optional<tinyusdz::Prim> *)local_4d20._16_8_;
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)err,(ulong)local_4d30.dynamic);
        if ((GeomMesh *)local_4d30.dynamic != (GeomMesh *)local_4d20) {
          operator_delete(local_4d30.dynamic,(ulong)((long)(OpType *)local_4d20._0_8_ + 1));
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
      ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
      *&poVar10->has_value_ = false;
LAB_001aac77:
      memset(&poVar10->contained,0,0x350);
      goto LAB_001aac7e;
    }
    PrimMetas::operator=((PrimMetas *)&local_3f80,&primspec->_metas);
    ::std::__cxx11::string::_M_assign((string *)local_3fd0);
    ::std::__cxx11::string::_M_assign((string *)&local_3fb0);
    local_3f90._0_4_ = primspec->_specifier;
    local_4d20._0_8_ = linb::any::vtable_for_type<tinyusdz::Model>()::table;
    pGVar9 = (GeomMesh *)operator_new(0xec0);
    Model::Model((Model *)pGVar9,(Model *)local_49a8);
    local_4d30.dynamic = pGVar9;
    Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d30);
LAB_001aaa91:
    ::std::__cxx11::string::_M_assign(local_4a88);
    *(bool *)local_4d20._16_8_ = true;
    Prim::Prim((Prim *)(local_4d20._16_8_ + 8),(Prim *)local_4cf8);
    Prim::~Prim((Prim *)local_4cf8);
    if ((pointer)local_4d20._0_8_ != (pointer)0x0) {
      (**(code **)((long)&((string *)(local_4d20._0_8_ + 8))->field_2 + 8))(&local_4d30);
    }
LAB_001aac7e:
    Model::~Model((Model *)local_49a8);
    return extraout_RAX;
  }
  local_49a8._0_8_ = &local_4998;
  local_4998._M_dataplus._M_p._0_4_ = 0x726f6658;
  local_4998._M_dataplus._M_p._4_1_ = 'm';
  local_4998._M_dataplus._M_p._5_1_ = '\0';
  local_49a8._8_8_ = (pointer)0x5;
  sVar2 = (primspec->_typeName)._M_string_length;
  if (sVar2 == 5) {
    piVar3 = (int *)(psVar1->_M_dataplus)._M_p;
    if ((char)piVar3[1] == 'm' && *piVar3 == 0x726f6658) {
      GPrim::GPrim((GPrim *)local_49a8);
      local_4cf8[0] = false;
      bVar7 = tinyusdz::prim::ReconstructPrim<tinyusdz::Xform>
                        (primspec,(Xform *)local_49a8,warn,err,(PrimReconstructOptions *)local_4cf8)
      ;
      if (bVar7) {
        PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),&primspec->_metas);
        ::std::__cxx11::string::_M_assign((string *)auStack_3f30);
        local_3f18._8_4_ = primspec->_specifier;
        local_4d20._0_8_ = linb::any::vtable_for_type<tinyusdz::Xform>()::table;
        pGVar9 = (GeomMesh *)operator_new(0x1e68);
        GPrim::GPrim((GPrim *)pGVar9,(GPrim *)local_49a8);
        local_4d30.dynamic = pGVar9;
        Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d30);
        ::std::__cxx11::string::_M_assign(local_4a88);
        __return_storage_ptr__->has_value_ = true;
        Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
        Prim::~Prim((Prim *)local_4cf8);
        if ((pointer)local_4d20._0_8_ != (pointer)0x0) {
          (**(code **)((long)&((string *)(local_4d20._0_8_ + 8))->field_2 + 8))(&local_4d30);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"ReconstructPrimFromPrimSpec",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
        poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x48d);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"Failed to reconstruct Prim from PrimSpec ",0x29);
        poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4cf8,(primspec->_typeName)._M_dataplus._M_p,
                             (primspec->_typeName)._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," elementName: ",0xe);
        poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,(primspec->_name)._M_dataplus._M_p,
                             (primspec->_name)._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)err,(ulong)local_4d30.dynamic);
          if ((GeomMesh *)local_4d30.dynamic != (GeomMesh *)local_4d20) {
            operator_delete(local_4d30.dynamic,(ulong)((long)(OpType *)local_4d20._0_8_ + 1));
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
        ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
        __return_storage_ptr__->has_value_ = false;
        memset(&__return_storage_ptr__->contained,0,0x350);
      }
      GPrim::~GPrim((GPrim *)local_49a8);
      return extraout_RAX_00;
    }
    piVar3 = (int *)(psVar1->_M_dataplus)._M_p;
    if ((char)piVar3[1] == 'l' && *piVar3 == 0x65646f4d) {
      local_4978._0_8_ = &local_4998.field_2;
      local_49a8._0_8_ = (pointer)0x0;
      local_49a8._8_8_ = (pointer)0x0;
      local_4998._M_dataplus._M_p._0_4_ = 0;
      local_4998._M_dataplus._M_p._4_1_ = '\0';
      local_4998._M_dataplus._M_p._5_1_ = '\0';
      local_4998._M_dataplus._M_p._6_1_ = '\0';
      local_4998._M_dataplus._M_p._7_1_ = '\0';
      local_4998.field_2._M_allocated_capacity._0_4_ = 0;
      local_4998.field_2._8_8_ = 0;
      local_4978._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_4978[0x18] = false;
      local_4978._8_8_ = local_4978._0_8_;
      memset(local_4338,0,0x308);
      local_41e8._448_4_ = _S_red;
      local_4020._0_8_ = (_Base_ptr)0x0;
      memset(local_4958,0,0x309);
      memset(local_4648,0,0x309);
      local_4020._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3fe8._0_8_ = local_3ff8;
      local_3ff8._0_4_ = _S_red;
      local_3ff8._8_8_ = (_Base_ptr)0x0;
      local_3fe8[0x10] = false;
      local_3fe8._17_3_ = 0;
      local_3fe8._20_4_ = (storage_t<unsigned_int>)0x0;
      local_3fd0._0_8_ = local_3fc0;
      local_3fd0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3fc0[0] = '\0';
      _local_3fb0 = &local_3fa0;
      local_3fa8 = 0;
      local_3fa0._M_local_buf[0] = false;
      local_3f90._0_4_ = _S_red;
      local_3f90._8_8_ = 0xffffffffffffffff;
      local_3f80._8_4_ = 0;
      local_3f70 = local_3f68 + 8;
      local_3f80._M_allocated_capacity._0_4_ = 0;
      local_3f80._M_local_buf[4] = '\0';
      local_3f68._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3f68[8] = '\0';
      local_3f50._0_1_ = 0;
      local_3e10[8] = 0;
      local_3ca0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3ca0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3ca0._16_8_ = (_Base_ptr)0x0;
      auStack_3c88._0_8_ = (_Base_ptr)0x0;
      local_3c68._0_8_ = (long)auStack_3c88 + 0x10;
      auStack_3c88._16_4_ = _S_red;
      auStack_3c88._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3f48._0_8_ = 0;
      local_3f48._8_8_ = 0;
      local_3f38 = (undefined1  [8])0x0;
      auStack_3f30._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_3f30._8_8_ = 0;
      auStack_3f30._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3f18[0] = 0;
      local_3f18._8_8_ = 0;
      auStack_3f08._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_3f08._8_8_ = 0;
      auStack_3f08._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3ef0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3ef0._8_8_ = 0;
      local_3ef0[0x10] = 0;
      local_3ef0._24_8_ = 0;
      auStack_3ed0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_3ed0._8_8_ = 0;
      auStack_3ec0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_3ec0._8_8_ = 0;
      auStack_3ec0._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_3ec0[0x18] = 0;
      local_3e70[0] = 0;
      local_3e90._16_8_ = 0;
      local_3e90._24_8_ = 0;
      local_3e90._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3e90._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3ea0._0_8_ = 0;
      local_3ea0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_3e50[8] = 0;
      auStack_3e60._8_8_ = 0;
      auStack_3e50._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3e70._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_3e60._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3e20._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3e20._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3e40._16_8_ = 0;
      local_3e40._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3e40._0_8_ = 0;
      local_3e40._8_8_ = 0;
      local_3e10._0_2_ = 0;
      auStack_3dd8[8] = 0;
      local_3df0._16_8_ = 0;
      auStack_3dd8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3df0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3df0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3e00._0_8_ = 0;
      local_3e00._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3db8[0x10] = 0;
      local_3db8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3db8._8_8_ = 0;
      local_3dc8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3dc8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3d90[0x10] = 0;
      local_3d90._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3d90._8_8_ = 0;
      local_3da0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3da0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3d58[0] = 0;
      local_3d68._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3d68._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3d78._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3d78._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_3d38[8] = 0;
      auStack_3d48._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_3d38._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3d58._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_3d48._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3d08[0x10] = 0;
      local_3d08._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3d08._8_8_ = 0;
      local_3d18._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3d18._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3d28._0_8_ = 0;
      local_3d28._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_3cd8[8] = 0;
      auStack_3ce8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_3cd8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3d08._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_3ce8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_3cb0[8] = 0;
      local_3cc8._16_8_ = 0;
      auStack_3cb0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3cc8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3cc8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3c68._16_8_ = (_Base_ptr)0x0;
      local_3c38._0_8_ = local_3c48;
      local_3c48._0_4_ = _S_red;
      local_3c48._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_3c08[0x10] = 0;
      auStack_3c08._17_8_ = 0;
      auStack_3c08._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_3c08[8] = 0;
      auStack_3c08._9_7_ = 0;
      local_3c18._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3c18._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3c38._16_8_ = (pointer)0x0;
      local_3c38._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_3bd0[8] = false;
      local_3be8._16_8_ = 0;
      auStack_3bd0._0_8_ = 0;
      local_3be8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3be8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      sStack_3bc0._16_1_ = 0;
      sStack_3bc0._17_8_ = 0;
      sStack_3bc0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      sStack_3bc0._8_1_ = 0;
      sStack_3bc0._9_7_ = 0;
      local_3b60._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3b60._0_8_ = 0;
      local_3b60._8_8_ = (pointer)0x0;
      local_3b40._16_8_ = local_3b40;
      local_3b40._0_4_ = 0;
      local_3b40._8_8_ = 0;
      auStack_3ba0._16_4_ = 0;
      auStack_3ba0._20_8_ = 0;
      auStack_3ba0[0] = false;
      auStack_3ba0._1_3_ = 0;
      auStack_3ba0._4_4_ = (storage_t<unsigned_int>)0x0;
      auStack_3ba0._8_4_ = 0;
      auStack_3ba0._12_4_ = 0;
      auStack_3b78._8_4_ = 0;
      auStack_3b78._12_8_ = 0;
      auStack_3ba0._32_8_ = 0;
      auStack_3b78._0_4_ = 0;
      auStack_3b78._4_4_ = 0;
      auStack_3b08._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_3b08._8_8_ = 0;
      auStack_3b08._16_8_ = 0;
      auStack_3b18._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_3b08._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_3b28._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      auStack_3b18._0_8_ = (storage_t<double>)0x0;
      local_4cf8[0] = false;
      local_4020._8_8_ = (_Base_ptr)(local_41e8 + 0x1c0);
      local_4020._16_8_ = (_Base_ptr)(local_41e8 + 0x1c0);
      local_3fe8._8_8_ = local_3fe8._0_8_;
      local_3c68._8_8_ = local_3c68._0_8_;
      local_3c38._8_8_ = local_3c38._0_8_;
      local_3b28._0_8_ = local_3b40._16_8_;
      bVar7 = tinyusdz::prim::ReconstructPrim<tinyusdz::Model>
                        (primspec,(Model *)local_49a8,local_4d00,err,
                         (PrimReconstructOptions *)local_4cf8);
      if (!bVar7) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"ReconstructPrimFromPrimSpec",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
        poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x48e);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"Failed to reconstruct Prim from PrimSpec ",0x29);
        poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4cf8,(primspec->_typeName)._M_dataplus._M_p,
                             (primspec->_typeName)._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," elementName: ",0xe);
        poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,(primspec->_name)._M_dataplus._M_p,
                             (primspec->_name)._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
        poVar10 = (optional<tinyusdz::Prim> *)local_4d20._16_8_;
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)err,(ulong)local_4d30.dynamic);
          if ((GeomMesh *)local_4d30.dynamic != (GeomMesh *)local_4d20) {
            operator_delete(local_4d30.dynamic,(ulong)((long)(OpType *)local_4d20._0_8_ + 1));
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
        ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
        *&poVar10->has_value_ = false;
        goto LAB_001aac77;
      }
      PrimMetas::operator=((PrimMetas *)&local_3f80,&primspec->_metas);
      ::std::__cxx11::string::_M_assign((string *)local_3fd0);
      local_3f90._0_4_ = primspec->_specifier;
      local_4d20._0_8_ = linb::any::vtable_for_type<tinyusdz::Model>()::table;
      pGVar9 = (GeomMesh *)operator_new(0xec0);
      Model::Model((Model *)pGVar9,(Model *)local_49a8);
      local_4d30.dynamic = pGVar9;
      Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d30);
      goto LAB_001aaa91;
    }
    local_4998._M_dataplus._M_p._0_4_ = 0x706f6353;
    local_4998._M_dataplus._M_p._4_1_ = 'e';
    local_4998._M_dataplus._M_p._5_1_ = '\0';
    local_49a8._8_8_ = (pointer)0x5;
    piVar3 = (int *)(psVar1->_M_dataplus)._M_p;
    if ((char)piVar3[1] == 'e' && *piVar3 == 0x706f6353) {
      Scope::Scope((Scope *)local_49a8);
      local_4cf8[0] = false;
      bVar7 = tinyusdz::prim::ReconstructPrim<tinyusdz::Scope>
                        (primspec,(Scope *)local_49a8,warn,err,(PrimReconstructOptions *)local_4cf8)
      ;
      if (bVar7) {
        PrimMetas::operator=((PrimMetas *)&local_3fa0,&primspec->_metas);
        ::std::__cxx11::string::_M_assign((string *)local_3fd0);
        local_3fb0 = primspec->_specifier;
        local_4d20._0_8_ = linb::any::vtable_for_type<tinyusdz::Scope>()::table;
        pGVar9 = (GeomMesh *)operator_new(0x1120);
        Scope::Scope((Scope *)pGVar9,(Scope *)local_49a8);
        local_4d30.dynamic = pGVar9;
        Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d30);
        ::std::__cxx11::string::_M_assign(local_4a88);
        __return_storage_ptr__->has_value_ = true;
        Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
        Prim::~Prim((Prim *)local_4cf8);
        if ((pointer)local_4d20._0_8_ != (pointer)0x0) {
          (**(code **)((long)&((string *)(local_4d20._0_8_ + 8))->field_2 + 8))(&local_4d30);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"ReconstructPrimFromPrimSpec",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
        poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x48f);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"Failed to reconstruct Prim from PrimSpec ",0x29);
        poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4cf8,(primspec->_typeName)._M_dataplus._M_p,
                             (primspec->_typeName)._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," elementName: ",0xe);
        poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,(primspec->_name)._M_dataplus._M_p,
                             (primspec->_name)._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)err,(ulong)local_4d30.dynamic);
          if ((GeomMesh *)local_4d30.dynamic != (GeomMesh *)local_4d20) {
            operator_delete(local_4d30.dynamic,(ulong)((long)(OpType *)local_4d20._0_8_ + 1));
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
        ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
        __return_storage_ptr__->has_value_ = false;
        memset(&__return_storage_ptr__->contained,0,0x350);
      }
      Scope::~Scope((Scope *)local_49a8);
      return extraout_RAX_02;
    }
LAB_001aab10:
    local_4998._M_dataplus._M_p._5_1_ = '\0';
    local_4998._M_dataplus._M_p._0_4_ = 0x65627543;
    local_49a8._8_8_ = (pointer)0x4;
    local_4998._M_dataplus._M_p._4_1_ = '\0';
    if (sVar2 == 5) {
      bVar7 = false;
LAB_001aaf99:
      bVar6 = false;
      goto LAB_001aaf9b;
    }
    if (*(int *)(psVar1->_M_dataplus)._M_p == 0x65627543) {
      GeomCube::GeomCube((GeomCube *)local_49a8);
      local_4cf8[0] = false;
      bVar7 = tinyusdz::prim::ReconstructPrim<tinyusdz::GeomCube>
                        (primspec,(GeomCube *)local_49a8,warn,err,
                         (PrimReconstructOptions *)local_4cf8);
      if (bVar7) {
        PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),&primspec->_metas);
        ::std::__cxx11::string::_M_assign((string *)auStack_3f30);
        local_3f18._8_4_ = primspec->_specifier;
        local_4d20._0_8_ = linb::any::vtable_for_type<tinyusdz::GeomCube>()::table;
        linb::any::do_construct<tinyusdz::GeomCube_const&,tinyusdz::GeomCube>
                  ((any *)&local_4d30,(GeomCube *)local_49a8);
        Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d30);
        ::std::__cxx11::string::_M_assign(local_4a88);
        __return_storage_ptr__->has_value_ = true;
        Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
        Prim::~Prim((Prim *)local_4cf8);
        if ((pointer)local_4d20._0_8_ != (pointer)0x0) {
          (**(code **)((long)&((string *)(local_4d20._0_8_ + 8))->field_2 + 8))(&local_4d30);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"ReconstructPrimFromPrimSpec",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
        poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x493);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"Failed to reconstruct Prim from PrimSpec ",0x29);
        poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4cf8,(primspec->_typeName)._M_dataplus._M_p,
                             (primspec->_typeName)._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," elementName: ",0xe);
        poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,(primspec->_name)._M_dataplus._M_p,
                             (primspec->_name)._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)err,(ulong)local_4d30.dynamic);
          if ((GeomMesh *)local_4d30.dynamic != (GeomMesh *)local_4d20) {
            operator_delete(local_4d30.dynamic,(ulong)((long)(OpType *)local_4d20._0_8_ + 1));
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
        ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
        __return_storage_ptr__->has_value_ = false;
        memset(&__return_storage_ptr__->contained,0,0x350);
      }
      GeomCube::~GeomCube((GeomCube *)local_49a8);
      return extraout_RAX_05;
    }
    local_4998._M_dataplus._M_p._0_4_ = 0x656e6f43;
    local_49a8._8_8_ = (pointer)0x4;
    local_4998._M_dataplus._M_p._4_1_ = '\0';
    if (*(int *)(psVar1->_M_dataplus)._M_p == 0x656e6f43) {
      GeomCone::GeomCone((GeomCone *)local_49a8);
      local_4cf8[0] = false;
      bVar7 = tinyusdz::prim::ReconstructPrim<tinyusdz::GeomCone>
                        (primspec,(GeomCone *)local_49a8,warn,err,
                         (PrimReconstructOptions *)local_4cf8);
      if (bVar7) {
        PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),&primspec->_metas);
        ::std::__cxx11::string::_M_assign((string *)auStack_3f30);
        local_3f18._8_4_ = primspec->_specifier;
        local_4d20._0_8_ = linb::any::vtable_for_type<tinyusdz::GeomCone>()::table;
        pGVar9 = (GeomMesh *)operator_new(0x25d0);
        GeomCone::GeomCone((GeomCone *)pGVar9,(GeomCone *)local_49a8);
        local_4d30.dynamic = pGVar9;
        Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d30);
        ::std::__cxx11::string::_M_assign(local_4a88);
        __return_storage_ptr__->has_value_ = true;
        Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
        Prim::~Prim((Prim *)local_4cf8);
        if ((pointer)local_4d20._0_8_ != (pointer)0x0) {
          (**(code **)((long)&((string *)(local_4d20._0_8_ + 8))->field_2 + 8))(&local_4d30);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"ReconstructPrimFromPrimSpec",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
        poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x494);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"Failed to reconstruct Prim from PrimSpec ",0x29);
        poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4cf8,(primspec->_typeName)._M_dataplus._M_p,
                             (primspec->_typeName)._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," elementName: ",0xe);
        poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,(primspec->_name)._M_dataplus._M_p,
                             (primspec->_name)._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)err,(ulong)local_4d30.dynamic);
          if ((GeomMesh *)local_4d30.dynamic != (GeomMesh *)local_4d20) {
            operator_delete(local_4d30.dynamic,(ulong)((long)(OpType *)local_4d20._0_8_ + 1));
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
        ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
        __return_storage_ptr__->has_value_ = false;
        memset(&__return_storage_ptr__->contained,0,0x350);
      }
      GeomCone::~GeomCone((GeomCone *)local_49a8);
      return extraout_RAX_09;
    }
    bVar6 = false;
LAB_001ab0d8:
    bVar7 = false;
  }
  else {
    local_4998._M_dataplus._M_p._0_4_ = 0x6873654d;
    local_49a8._8_8_ = (pointer)0x4;
    local_4998._M_dataplus._M_p._4_1_ = '\0';
    if (sVar2 == 4) {
      if (*(int *)(psVar1->_M_dataplus)._M_p == 0x6873654d) {
        GeomMesh::GeomMesh((GeomMesh *)local_49a8);
        local_4cf8[0] = false;
        bVar7 = tinyusdz::prim::ReconstructPrim<tinyusdz::GeomMesh>
                          (primspec,(GeomMesh *)local_49a8,warn,err,
                           (PrimReconstructOptions *)local_4cf8);
        if (bVar7) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),&primspec->_metas);
          ::std::__cxx11::string::_M_assign((string *)auStack_3f30);
          local_3f18._8_4_ = primspec->_specifier;
          local_4d20._0_8_ = linb::any::vtable_for_type<tinyusdz::GeomMesh>()::table;
          pGVar9 = (GeomMesh *)operator_new(0x4978);
          GeomMesh::GeomMesh(pGVar9,(GeomMesh *)local_49a8);
          local_4d30.dynamic = pGVar9;
          Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d30);
          ::std::__cxx11::string::_M_assign(local_4a88);
          __return_storage_ptr__->has_value_ = true;
          Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if ((pointer)local_4d20._0_8_ != (pointer)0x0) {
            (**(code **)((long)&((string *)(local_4d20._0_8_ + 8))->field_2 + 8))(&local_4d30);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"ReconstructPrimFromPrimSpec",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
          poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x490);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"Failed to reconstruct Prim from PrimSpec ",0x29);
          poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4cf8,(primspec->_typeName)._M_dataplus._M_p,
                               (primspec->_typeName)._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," elementName: ",0xe);
          poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,(primspec->_name)._M_dataplus._M_p,
                               (primspec->_name)._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append((char *)err,(ulong)local_4d30.dynamic);
            if ((GeomMesh *)local_4d30.dynamic != (GeomMesh *)local_4d20) {
              operator_delete(local_4d30.dynamic,(ulong)((long)(OpType *)local_4d20._0_8_ + 1));
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        GeomMesh::~GeomMesh((GeomMesh *)local_49a8);
        return extraout_RAX_01;
      }
      goto LAB_001aab10;
    }
    local_4998._M_dataplus._M_p._0_4_ = 0x6e696f50;
    local_4998._M_dataplus._M_p._4_1_ = 't';
    local_4998._M_dataplus._M_p._5_1_ = 's';
    local_49a8._8_8_ = (pointer)0x6;
    local_4998._M_dataplus._M_p._6_1_ = '\0';
    bVar7 = sVar2 == 6;
    if (bVar7) {
      piVar3 = (int *)(psVar1->_M_dataplus)._M_p;
      if ((short)piVar3[1] == 0x7374 && *piVar3 == 0x6e696f50) {
        GeomPoints::GeomPoints((GeomPoints *)local_49a8);
        local_4cf8[0] = false;
        bVar7 = tinyusdz::prim::ReconstructPrim<tinyusdz::GeomPoints>
                          (primspec,(GeomPoints *)local_49a8,warn,err,
                           (PrimReconstructOptions *)local_4cf8);
        if (bVar7) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),&primspec->_metas);
          ::std::__cxx11::string::_M_assign((string *)auStack_3f30);
          local_3f18._8_4_ = primspec->_specifier;
          local_4d20._0_8_ = linb::any::vtable_for_type<tinyusdz::GeomPoints>()::table;
          pGVar9 = (GeomMesh *)operator_new(0x2d38);
          GeomPoints::GeomPoints((GeomPoints *)pGVar9,(GeomPoints *)local_49a8);
          local_4d30.dynamic = pGVar9;
          Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d30);
          ::std::__cxx11::string::_M_assign(local_4a88);
          __return_storage_ptr__->has_value_ = true;
          Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if ((pointer)local_4d20._0_8_ != (pointer)0x0) {
            (**(code **)((long)&((string *)(local_4d20._0_8_ + 8))->field_2 + 8))(&local_4d30);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"ReconstructPrimFromPrimSpec",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
          poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x491);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"Failed to reconstruct Prim from PrimSpec ",0x29);
          poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4cf8,(primspec->_typeName)._M_dataplus._M_p,
                               (primspec->_typeName)._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," elementName: ",0xe);
          poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,(primspec->_name)._M_dataplus._M_p,
                               (primspec->_name)._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append((char *)err,(ulong)local_4d30.dynamic);
            if ((GeomMesh *)local_4d30.dynamic != (GeomMesh *)local_4d20) {
              operator_delete(local_4d30.dynamic,(ulong)((long)(OpType *)local_4d20._0_8_ + 1));
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        GeomPoints::~GeomPoints((GeomPoints *)local_49a8);
        return extraout_RAX_06;
      }
      goto LAB_001aaf99;
    }
    local_4998._M_dataplus._M_p._0_4_ = 0x696c7943;
    local_4998._M_dataplus._M_p._4_1_ = 'n';
    local_4998._M_dataplus._M_p._5_1_ = 'd';
    local_4998._M_dataplus._M_p._6_1_ = 'e';
    local_4998._M_dataplus._M_p._7_1_ = 'r';
    local_49a8._8_8_ = (pointer)0x8;
    local_4998._M_string_length._0_1_ = '\0';
    if (sVar2 != 8) goto LAB_001aaf99;
    if (*(long *)(psVar1->_M_dataplus)._M_p == 0x7265646e696c7943) {
      GeomCylinder::GeomCylinder((GeomCylinder *)local_49a8);
      local_4cf8[0] = false;
      bVar7 = tinyusdz::prim::ReconstructPrim<tinyusdz::GeomCylinder>
                        (primspec,(GeomCylinder *)local_49a8,warn,err,
                         (PrimReconstructOptions *)local_4cf8);
      if (bVar7) {
        PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),&primspec->_metas);
        ::std::__cxx11::string::_M_assign((string *)auStack_3f30);
        local_3f18._8_4_ = primspec->_specifier;
        local_4d20._0_8_ = linb::any::vtable_for_type<tinyusdz::GeomCylinder>()::table;
        pGVar9 = (GeomMesh *)operator_new(0x25d0);
        GeomCylinder::GeomCylinder((GeomCylinder *)pGVar9,(GeomCylinder *)local_49a8);
        local_4d30.dynamic = pGVar9;
        Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d30);
        ::std::__cxx11::string::_M_assign(local_4a88);
        __return_storage_ptr__->has_value_ = true;
        Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
        Prim::~Prim((Prim *)local_4cf8);
        if ((pointer)local_4d20._0_8_ != (pointer)0x0) {
          (**(code **)((long)&((string *)(local_4d20._0_8_ + 8))->field_2 + 8))(&local_4d30);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"ReconstructPrimFromPrimSpec",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
        poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x492);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"Failed to reconstruct Prim from PrimSpec ",0x29);
        poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4cf8,(primspec->_typeName)._M_dataplus._M_p,
                             (primspec->_typeName)._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," elementName: ",0xe);
        poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,(primspec->_name)._M_dataplus._M_p,
                             (primspec->_name)._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)err,(ulong)local_4d30.dynamic);
          if ((GeomMesh *)local_4d30.dynamic != (GeomMesh *)local_4d20) {
            operator_delete(local_4d30.dynamic,(ulong)((long)(OpType *)local_4d20._0_8_ + 1));
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
        ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
        __return_storage_ptr__->has_value_ = false;
        memset(&__return_storage_ptr__->contained,0,0x350);
      }
      GeomCylinder::~GeomCylinder((GeomCylinder *)local_49a8);
      return extraout_RAX_12;
    }
    bVar6 = true;
    bVar7 = false;
LAB_001aaf9b:
    local_4998._M_dataplus._M_p._0_4_ = 0x65687053;
    local_4998._M_dataplus._M_p._4_1_ = 'r';
    local_4998._M_dataplus._M_p._5_1_ = 'e';
    local_49a8._8_8_ = (pointer)0x6;
    local_4998._M_dataplus._M_p._6_1_ = '\0';
    if (!bVar7) goto LAB_001ab0d8;
    piVar3 = (int *)(psVar1->_M_dataplus)._M_p;
    bVar7 = true;
    if ((short)piVar3[1] == 0x6572 && *piVar3 == 0x65687053) {
      GeomSphere::GeomSphere((GeomSphere *)local_49a8);
      local_4cf8[0] = false;
      bVar7 = tinyusdz::prim::ReconstructPrim<tinyusdz::GeomSphere>
                        (primspec,(GeomSphere *)local_49a8,warn,err,
                         (PrimReconstructOptions *)local_4cf8);
      if (bVar7) {
        PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),&primspec->_metas);
        ::std::__cxx11::string::_M_assign((string *)auStack_3f30);
        local_3f18._8_4_ = primspec->_specifier;
        local_4d20._0_8_ = linb::any::vtable_for_type<tinyusdz::GeomSphere>()::table;
        linb::any::do_construct<tinyusdz::GeomSphere_const&,tinyusdz::GeomSphere>
                  ((any *)&local_4d30,(GeomSphere *)local_49a8);
        Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d30);
        ::std::__cxx11::string::_M_assign(local_4a88);
        __return_storage_ptr__->has_value_ = true;
        Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
        Prim::~Prim((Prim *)local_4cf8);
        if ((pointer)local_4d20._0_8_ != (pointer)0x0) {
          (**(code **)((long)&((string *)(local_4d20._0_8_ + 8))->field_2 + 8))(&local_4d30);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"ReconstructPrimFromPrimSpec",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
        poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x495);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"Failed to reconstruct Prim from PrimSpec ",0x29);
        poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4cf8,(primspec->_typeName)._M_dataplus._M_p,
                             (primspec->_typeName)._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," elementName: ",0xe);
        poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,(primspec->_name)._M_dataplus._M_p,
                             (primspec->_name)._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)err,(ulong)local_4d30.dynamic);
          if ((GeomMesh *)local_4d30.dynamic != (GeomMesh *)local_4d20) {
            operator_delete(local_4d30.dynamic,(ulong)((long)(OpType *)local_4d20._0_8_ + 1));
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
        ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
        __return_storage_ptr__->has_value_ = false;
        memset(&__return_storage_ptr__->contained,0,0x350);
      }
      GeomSphere::~GeomSphere((GeomSphere *)local_49a8);
      return extraout_RAX_03;
    }
  }
  local_4998._M_dataplus._M_p._0_4_ = 0x73706143;
  local_4998._M_dataplus._M_p._4_1_ = 'u';
  local_4998._M_dataplus._M_p._5_1_ = 'l';
  local_4998._M_dataplus._M_p._6_1_ = 'e';
  local_49a8._8_8_ = (pointer)0x7;
  local_4998._M_dataplus._M_p._7_1_ = '\0';
  if (sVar2 == 7) {
    piVar3 = (int *)(psVar1->_M_dataplus)._M_p;
    if (*(int *)((long)piVar3 + 3) == 0x656c7573 && *piVar3 == 0x73706143) {
      GeomCapsule::GeomCapsule((GeomCapsule *)local_49a8);
      local_4cf8[0] = false;
      bVar7 = tinyusdz::prim::ReconstructPrim<tinyusdz::GeomCapsule>
                        (primspec,(GeomCapsule *)local_49a8,warn,err,
                         (PrimReconstructOptions *)local_4cf8);
      if (bVar7) {
        PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),&primspec->_metas);
        ::std::__cxx11::string::_M_assign((string *)auStack_3f30);
        local_3f18._8_4_ = primspec->_specifier;
        local_4d20._0_8_ = linb::any::vtable_for_type<tinyusdz::GeomCapsule>()::table;
        pGVar9 = (GeomMesh *)operator_new(0x25d0);
        GeomCapsule::GeomCapsule((GeomCapsule *)pGVar9,(GeomCapsule *)local_49a8);
        local_4d30.dynamic = pGVar9;
        Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d30);
        ::std::__cxx11::string::_M_assign(local_4a88);
        __return_storage_ptr__->has_value_ = true;
        Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
        Prim::~Prim((Prim *)local_4cf8);
        if ((pointer)local_4d20._0_8_ != (pointer)0x0) {
          (**(code **)((long)&((string *)(local_4d20._0_8_ + 8))->field_2 + 8))(&local_4d30);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"ReconstructPrimFromPrimSpec",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
        poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x496);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"Failed to reconstruct Prim from PrimSpec ",0x29);
        poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4cf8,(primspec->_typeName)._M_dataplus._M_p,
                             (primspec->_typeName)._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," elementName: ",0xe);
        poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,(primspec->_name)._M_dataplus._M_p,
                             (primspec->_name)._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)err,(ulong)local_4d30.dynamic);
          if ((GeomMesh *)local_4d30.dynamic != (GeomMesh *)local_4d20) {
            operator_delete(local_4d30.dynamic,(ulong)((long)(OpType *)local_4d20._0_8_ + 1));
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
        ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
        __return_storage_ptr__->has_value_ = false;
        memset(&__return_storage_ptr__->contained,0,0x350);
      }
      GeomCapsule::~GeomCapsule((GeomCapsule *)local_49a8);
      return extraout_RAX_04;
    }
LAB_001ab37a:
    bVar5 = false;
  }
  else {
    local_4998._M_dataplus._M_p._0_4_ = 0x69736142;
    local_4998._M_dataplus._M_p._4_1_ = 's';
    local_4998._M_dataplus._M_p._5_1_ = 'C';
    local_4998._M_dataplus._M_p._6_1_ = 'u';
    local_4998._M_dataplus._M_p._7_1_ = 'r';
    local_4998._M_string_length._0_1_ = 'v';
    local_4998._M_string_length._1_1_ = 'e';
    local_4998._M_string_length._2_1_ = 's';
    local_49a8._8_8_ = (pointer)0xb;
    local_4998._M_string_length._3_1_ = '\0';
    if (sVar2 != 0xb) goto LAB_001ab37a;
    plVar4 = (long *)(psVar1->_M_dataplus)._M_p;
    bVar5 = true;
    if (*(long *)((long)plVar4 + 3) == 0x7365767275437369 && *plVar4 == 0x7275437369736142) {
      GeomBasisCurves::GeomBasisCurves((GeomBasisCurves *)local_49a8);
      local_4cf8[0] = false;
      bVar7 = tinyusdz::prim::ReconstructPrim<tinyusdz::GeomBasisCurves>
                        (primspec,(GeomBasisCurves *)local_49a8,warn,err,
                         (PrimReconstructOptions *)local_4cf8);
      if (bVar7) {
        PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),&primspec->_metas);
        ::std::__cxx11::string::_M_assign((string *)auStack_3f30);
        local_3f18._8_4_ = primspec->_specifier;
        local_4d20._0_8_ = linb::any::vtable_for_type<tinyusdz::GeomBasisCurves>()::table;
        pGVar9 = (GeomMesh *)operator_new(0x33e0);
        GeomBasisCurves::GeomBasisCurves((GeomBasisCurves *)pGVar9,(GeomBasisCurves *)local_49a8);
        local_4d30.dynamic = pGVar9;
        Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d30);
        ::std::__cxx11::string::_M_assign(local_4a88);
        __return_storage_ptr__->has_value_ = true;
        Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
        Prim::~Prim((Prim *)local_4cf8);
        if ((pointer)local_4d20._0_8_ != (pointer)0x0) {
          (**(code **)((long)&((string *)(local_4d20._0_8_ + 8))->field_2 + 8))(&local_4d30);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"ReconstructPrimFromPrimSpec",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
        poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x497);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"Failed to reconstruct Prim from PrimSpec ",0x29);
        poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4cf8,(primspec->_typeName)._M_dataplus._M_p,
                             (primspec->_typeName)._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," elementName: ",0xe);
        poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,(primspec->_name)._M_dataplus._M_p,
                             (primspec->_name)._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)err,(ulong)local_4d30.dynamic);
          if ((GeomMesh *)local_4d30.dynamic != (GeomMesh *)local_4d20) {
            operator_delete(local_4d30.dynamic,(ulong)((long)(OpType *)local_4d20._0_8_ + 1));
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
        ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
        __return_storage_ptr__->has_value_ = false;
        memset(&__return_storage_ptr__->contained,0,0x350);
      }
      GeomBasisCurves::~GeomBasisCurves((GeomBasisCurves *)local_49a8);
      return extraout_RAX_10;
    }
  }
  local_4998._M_dataplus._M_p._0_4_ = 0x656d6143;
  local_4998._M_dataplus._M_p._4_1_ = 'r';
  local_4998._M_dataplus._M_p._5_1_ = 'a';
  local_49a8._8_8_ = (pointer)0x6;
  local_4998._M_dataplus._M_p._6_1_ = '\0';
  if ((bVar7) &&
     (piVar3 = (int *)(psVar1->_M_dataplus)._M_p,
     (short)piVar3[1] == 0x6172 && *piVar3 == 0x656d6143)) {
    GeomCamera::GeomCamera((GeomCamera *)local_49a8);
    local_4cf8[0] = false;
    bVar7 = tinyusdz::prim::ReconstructPrim<tinyusdz::GeomCamera>
                      (primspec,(GeomCamera *)local_49a8,warn,err,
                       (PrimReconstructOptions *)local_4cf8);
    if (bVar7) {
      PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),&primspec->_metas);
      ::std::__cxx11::string::_M_assign((string *)auStack_3f30);
      local_3f18._8_4_ = primspec->_specifier;
      local_4d20._0_8_ = linb::any::vtable_for_type<tinyusdz::GeomCamera>()::table;
      pGVar9 = (GeomMesh *)operator_new(0x41a8);
      GeomCamera::GeomCamera((GeomCamera *)pGVar9,(GeomCamera *)local_49a8);
      local_4d30.dynamic = pGVar9;
      Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d30);
      ::std::__cxx11::string::_M_assign(local_4a88);
      __return_storage_ptr__->has_value_ = true;
      Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
      Prim::~Prim((Prim *)local_4cf8);
      if ((pointer)local_4d20._0_8_ != (pointer)0x0) {
        (**(code **)((long)&((string *)(local_4d20._0_8_ + 8))->field_2 + 8))(&local_4d30);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                 ,0x55);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,"ReconstructPrimFromPrimSpec",0x1b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
      poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x498);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,"Failed to reconstruct Prim from PrimSpec ",0x29);
      poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4cf8,(primspec->_typeName)._M_dataplus._M_p,
                           (primspec->_typeName)._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," elementName: ",0xe);
      poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,(primspec->_name)._M_dataplus._M_p,
                           (primspec->_name)._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)err,(ulong)local_4d30.dynamic);
        if ((GeomMesh *)local_4d30.dynamic != (GeomMesh *)local_4d20) {
          operator_delete(local_4d30.dynamic,(ulong)((long)(OpType *)local_4d20._0_8_ + 1));
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
      ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
      __return_storage_ptr__->has_value_ = false;
      memset(&__return_storage_ptr__->contained,0,0x350);
    }
    GeomCamera::~GeomCamera((GeomCamera *)local_49a8);
    return extraout_RAX_07;
  }
  local_4998._M_dataplus._M_p._0_4_ = 0x65687053;
  local_4998._M_dataplus._M_p._4_1_ = 'r';
  local_4998._M_dataplus._M_p._5_1_ = 'e';
  local_4998._M_dataplus._M_p._6_1_ = 'L';
  local_4998._M_dataplus._M_p._7_1_ = 'i';
  local_4998._M_string_length._0_1_ = 'g';
  local_4998._M_string_length._1_1_ = 'h';
  local_4998._M_string_length._2_1_ = 't';
  local_49a8._8_8_ = (pointer)0xb;
  local_4998._M_string_length._3_1_ = '\0';
  if ((bVar5) &&
     (plVar4 = (long *)(psVar1->_M_dataplus)._M_p,
     *(long *)((long)plVar4 + 3) == 0x746867694c657265 && *plVar4 == 0x694c657265687053)) {
    SphereLight::SphereLight((SphereLight *)local_49a8);
    local_4cf8[0] = false;
    bVar7 = tinyusdz::prim::ReconstructPrim<tinyusdz::SphereLight>
                      (primspec,(SphereLight *)local_49a8,warn,err,
                       (PrimReconstructOptions *)local_4cf8);
    if (bVar7) {
      PrimMetas::operator=((PrimMetas *)(local_2ee0 + 0x278),&primspec->_metas);
      ::std::__cxx11::string::_M_assign(local_48c0);
      local_48c0._32_4_ = primspec->_specifier;
      local_4d20._0_8_ = linb::any::vtable_for_type<tinyusdz::SphereLight>()::table;
      linb::any::do_construct<tinyusdz::SphereLight_const&,tinyusdz::SphereLight>
                ((any *)&local_4d30,(SphereLight *)local_49a8);
      Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d30);
      ::std::__cxx11::string::_M_assign(local_4a88);
      __return_storage_ptr__->has_value_ = true;
      Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
      Prim::~Prim((Prim *)local_4cf8);
      if ((pointer)local_4d20._0_8_ != (pointer)0x0) {
        (**(code **)((long)&((string *)(local_4d20._0_8_ + 8))->field_2 + 8))(&local_4d30);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                 ,0x55);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,"ReconstructPrimFromPrimSpec",0x1b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
      poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x49a);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,"Failed to reconstruct Prim from PrimSpec ",0x29);
      poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4cf8,(primspec->_typeName)._M_dataplus._M_p,
                           (primspec->_typeName)._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," elementName: ",0xe);
      poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,(primspec->_name)._M_dataplus._M_p,
                           (primspec->_name)._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)err,(ulong)local_4d30.dynamic);
        if ((GeomMesh *)local_4d30.dynamic != (GeomMesh *)local_4d20) {
          operator_delete(local_4d30.dynamic,(ulong)((long)(OpType *)local_4d20._0_8_ + 1));
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
      ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
      __return_storage_ptr__->has_value_ = false;
      memset(&__return_storage_ptr__->contained,0,0x350);
    }
    SphereLight::~SphereLight((SphereLight *)local_49a8);
    return extraout_RAX_08;
  }
  local_4998._M_dataplus._M_p._0_4_ = 0x656d6f44;
  local_4998._M_dataplus._M_p._4_1_ = 'L';
  local_4998._M_dataplus._M_p._5_1_ = 'i';
  local_4998._M_dataplus._M_p._6_1_ = 'g';
  local_4998._M_dataplus._M_p._7_1_ = 'h';
  local_4998._M_string_length._0_1_ = 't';
  local_4998._M_string_length._1_1_ = '\0';
  local_49a8._8_8_ = (pointer)0x9;
  if (sVar2 == 9) {
    plVar4 = (long *)(psVar1->_M_dataplus)._M_p;
    if ((char)plVar4[1] == 't' && *plVar4 == 0x6867694c656d6f44) {
      DomeLight::DomeLight((DomeLight *)local_49a8);
      local_4cf8[0] = false;
      bVar7 = tinyusdz::prim::ReconstructPrim<tinyusdz::DomeLight>
                        (primspec,(DomeLight *)local_49a8,warn,err,
                         (PrimReconstructOptions *)local_4cf8);
      if (bVar7) {
        PrimMetas::operator=((PrimMetas *)local_2ee0,&primspec->_metas);
        ::std::__cxx11::string::_M_assign(local_48c0);
        local_48c0._32_4_ = primspec->_specifier;
        local_4d20._0_8_ = linb::any::vtable_for_type<tinyusdz::DomeLight>()::table;
        pGVar9 = (GeomMesh *)operator_new(0x26a0);
        DomeLight::DomeLight((DomeLight *)pGVar9,(DomeLight *)local_49a8);
        local_4d30.dynamic = pGVar9;
        Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d30);
        ::std::__cxx11::string::_M_assign(local_4a88);
        __return_storage_ptr__->has_value_ = true;
        Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
        Prim::~Prim((Prim *)local_4cf8);
        if ((pointer)local_4d20._0_8_ != (pointer)0x0) {
          (**(code **)((long)&((string *)(local_4d20._0_8_ + 8))->field_2 + 8))(&local_4d30);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"ReconstructPrimFromPrimSpec",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
        poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x49b);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"Failed to reconstruct Prim from PrimSpec ",0x29);
        poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4cf8,(primspec->_typeName)._M_dataplus._M_p,
                             (primspec->_typeName)._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," elementName: ",0xe);
        poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,(primspec->_name)._M_dataplus._M_p,
                             (primspec->_name)._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)err,(ulong)local_4d30.dynamic);
          if ((GeomMesh *)local_4d30.dynamic != (GeomMesh *)local_4d20) {
            operator_delete(local_4d30.dynamic,(ulong)((long)(OpType *)local_4d20._0_8_ + 1));
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
        ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
        __return_storage_ptr__->has_value_ = false;
        memset(&__return_storage_ptr__->contained,0,0x350);
      }
      DomeLight::~DomeLight((DomeLight *)local_49a8);
      return extraout_RAX_11;
    }
    local_4998._M_dataplus._M_p._0_4_ = 0x6b736944;
    local_4998._M_dataplus._M_p._4_1_ = 'L';
    local_4998._M_dataplus._M_p._5_1_ = 'i';
    local_4998._M_dataplus._M_p._6_1_ = 'g';
    local_4998._M_dataplus._M_p._7_1_ = 'h';
    local_4998._M_string_length._0_1_ = 't';
    local_4998._M_string_length._1_1_ = '\0';
    local_49a8._8_8_ = (pointer)0x9;
    plVar4 = (long *)(psVar1->_M_dataplus)._M_p;
    if ((char)plVar4[1] == 't' && *plVar4 == 0x6867694c6b736944) {
      DiskLight::DiskLight((DiskLight *)local_49a8);
      local_4cf8[0] = false;
      bVar7 = tinyusdz::prim::ReconstructPrim<tinyusdz::DiskLight>
                        (primspec,(DiskLight *)local_49a8,warn,err,
                         (PrimReconstructOptions *)local_4cf8);
      if (bVar7) {
        PrimMetas::operator=((PrimMetas *)(local_2ee0 + 0x278),&primspec->_metas);
        ::std::__cxx11::string::_M_assign(local_48c0);
        local_48c0._32_4_ = primspec->_specifier;
        local_4d20._0_8_ = linb::any::vtable_for_type<tinyusdz::DiskLight>()::table;
        linb::any::do_construct<tinyusdz::DiskLight_const&,tinyusdz::DiskLight>
                  ((any *)&local_4d30,(DiskLight *)local_49a8);
        Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d30);
        ::std::__cxx11::string::_M_assign(local_4a88);
        __return_storage_ptr__->has_value_ = true;
        Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
        Prim::~Prim((Prim *)local_4cf8);
        if ((pointer)local_4d20._0_8_ != (pointer)0x0) {
          (**(code **)((long)&((string *)(local_4d20._0_8_ + 8))->field_2 + 8))(&local_4d30);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"ReconstructPrimFromPrimSpec",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
        poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x49d);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"Failed to reconstruct Prim from PrimSpec ",0x29);
        poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4cf8,(primspec->_typeName)._M_dataplus._M_p,
                             (primspec->_typeName)._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," elementName: ",0xe);
        poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,(primspec->_name)._M_dataplus._M_p,
                             (primspec->_name)._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)err,(ulong)local_4d30.dynamic);
          if ((GeomMesh *)local_4d30.dynamic != (GeomMesh *)local_4d20) {
            operator_delete(local_4d30.dynamic,(ulong)((long)(OpType *)local_4d20._0_8_ + 1));
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
        ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
        __return_storage_ptr__->has_value_ = false;
        memset(&__return_storage_ptr__->contained,0,0x350);
      }
      DiskLight::~DiskLight((DiskLight *)local_49a8);
      return extraout_RAX_13;
    }
  }
  else {
    local_4998._M_dataplus._M_p._0_4_ = 0x696c7943;
    local_4998._M_dataplus._M_p._4_1_ = 'n';
    local_4998._M_dataplus._M_p._5_1_ = 'd';
    local_4998._M_dataplus._M_p._6_1_ = 'e';
    local_4998._M_dataplus._M_p._7_1_ = 'r';
    local_4998._M_string_length._0_1_ = 'L';
    local_4998._M_string_length._1_1_ = 'i';
    local_4998._M_string_length._2_1_ = 'g';
    local_4998._M_string_length._3_1_ = 'h';
    local_4998._M_string_length._4_1_ = 't';
    local_49a8._8_8_ = (pointer)0xd;
    local_4998._M_string_length._5_1_ = '\0';
    if (sVar2 == 0xd) {
      plVar4 = (long *)(psVar1->_M_dataplus)._M_p;
      if (*(long *)((long)plVar4 + 5) == 0x746867694c726564 && *plVar4 == 0x7265646e696c7943) {
        CylinderLight::CylinderLight((CylinderLight *)local_49a8);
        local_4cf8[0] = false;
        bVar7 = tinyusdz::prim::ReconstructPrim<tinyusdz::CylinderLight>
                          (primspec,(CylinderLight *)local_49a8,warn,err,
                           (PrimReconstructOptions *)local_4cf8);
        if (bVar7) {
          PrimMetas::operator=((PrimMetas *)(local_2ee0 + 0x278),&primspec->_metas);
          ::std::__cxx11::string::_M_assign(local_48c0);
          local_48c0._32_4_ = primspec->_specifier;
          local_4d20._0_8_ = linb::any::vtable_for_type<tinyusdz::CylinderLight>()::table;
          pGVar9 = (GeomMesh *)operator_new(0x2678);
          CylinderLight::CylinderLight((CylinderLight *)pGVar9,(CylinderLight *)local_49a8);
          local_4d30.dynamic = pGVar9;
          Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d30);
          ::std::__cxx11::string::_M_assign(local_4a88);
          __return_storage_ptr__->has_value_ = true;
          Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if ((pointer)local_4d20._0_8_ != (pointer)0x0) {
            (**(code **)((long)&((string *)(local_4d20._0_8_ + 8))->field_2 + 8))(&local_4d30);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"ReconstructPrimFromPrimSpec",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
          poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x49c);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"Failed to reconstruct Prim from PrimSpec ",0x29);
          poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4cf8,(primspec->_typeName)._M_dataplus._M_p,
                               (primspec->_typeName)._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," elementName: ",0xe);
          poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,(primspec->_name)._M_dataplus._M_p,
                               (primspec->_name)._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append((char *)err,(ulong)local_4d30.dynamic);
            if ((GeomMesh *)local_4d30.dynamic != (GeomMesh *)local_4d20) {
              operator_delete(local_4d30.dynamic,(ulong)((long)(OpType *)local_4d20._0_8_ + 1));
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        CylinderLight::~CylinderLight((CylinderLight *)local_49a8);
        return extraout_RAX_15;
      }
      bVar5 = true;
      goto LAB_001ac157;
    }
    local_4998._M_dataplus._M_p._0_4_ = 0x74736944;
    local_4998._M_dataplus._M_p._4_1_ = 'a';
    local_4998._M_dataplus._M_p._5_1_ = 'n';
    local_4998._M_dataplus._M_p._6_1_ = 't';
    local_4998._M_dataplus._M_p._7_1_ = 'L';
    local_4998._M_string_length._0_1_ = 'i';
    local_4998._M_string_length._1_1_ = 'g';
    local_4998._M_string_length._2_1_ = 'h';
    local_4998._M_string_length._3_1_ = 't';
    local_49a8._8_8_ = (pointer)0xc;
    local_4998._M_string_length._4_1_ = '\0';
    if ((sVar2 == 0xc) &&
       (plVar4 = (long *)(psVar1->_M_dataplus)._M_p,
       (int)plVar4[1] == 0x74686769 && *plVar4 == 0x4c746e6174736944)) {
      DistantLight::DistantLight((DistantLight *)local_49a8);
      local_4cf8[0] = false;
      bVar7 = tinyusdz::prim::ReconstructPrim<tinyusdz::DistantLight>
                        (primspec,(DistantLight *)local_49a8,warn,err,
                         (PrimReconstructOptions *)local_4cf8);
      if (bVar7) {
        PrimMetas::operator=((PrimMetas *)local_2ee0,&primspec->_metas);
        ::std::__cxx11::string::_M_assign(local_48c0);
        local_48c0._32_4_ = primspec->_specifier;
        local_4d20._0_8_ = linb::any::vtable_for_type<tinyusdz::DistantLight>()::table;
        linb::any::do_construct<tinyusdz::DistantLight_const&,tinyusdz::DistantLight>
                  ((any *)&local_4d30,(DistantLight *)local_49a8);
        Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d30);
        ::std::__cxx11::string::_M_assign(local_4a88);
        __return_storage_ptr__->has_value_ = true;
        Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
        Prim::~Prim((Prim *)local_4cf8);
        if ((pointer)local_4d20._0_8_ != (pointer)0x0) {
          (**(code **)((long)&((string *)(local_4d20._0_8_ + 8))->field_2 + 8))(&local_4d30);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"ReconstructPrimFromPrimSpec",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
        poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x49e);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"Failed to reconstruct Prim from PrimSpec ",0x29);
        poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4cf8,(primspec->_typeName)._M_dataplus._M_p,
                             (primspec->_typeName)._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," elementName: ",0xe);
        poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,(primspec->_name)._M_dataplus._M_p,
                             (primspec->_name)._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)err,(ulong)local_4d30.dynamic);
          if ((GeomMesh *)local_4d30.dynamic != (GeomMesh *)local_4d20) {
            operator_delete(local_4d30.dynamic,(ulong)((long)(OpType *)local_4d20._0_8_ + 1));
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
        ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
        __return_storage_ptr__->has_value_ = false;
        memset(&__return_storage_ptr__->contained,0,0x350);
      }
      DistantLight::~DistantLight((DistantLight *)local_49a8);
      return extraout_RAX_20;
    }
  }
  bVar5 = false;
LAB_001ac157:
  local_4998._M_dataplus._M_p._0_4_ = 0x6c656b53;
  local_4998._M_dataplus._M_p._4_1_ = 'R';
  local_4998._M_dataplus._M_p._5_1_ = 'o';
  local_4998._M_dataplus._M_p._6_1_ = 'o';
  local_4998._M_dataplus._M_p._7_1_ = 't';
  local_49a8._8_8_ = (pointer)0x8;
  local_4998._M_string_length._0_1_ = '\0';
  if (bVar6) {
    if (*(long *)(psVar1->_M_dataplus)._M_p == 0x746f6f526c656b53) {
      SkelRoot::SkelRoot((SkelRoot *)local_49a8);
      local_4cf8[0] = false;
      bVar7 = tinyusdz::prim::ReconstructPrim<tinyusdz::SkelRoot>
                        (primspec,(SkelRoot *)local_49a8,warn,err,
                         (PrimReconstructOptions *)local_4cf8);
      if (bVar7) {
        PrimMetas::operator=((PrimMetas *)local_3df0,&primspec->_metas);
        ::std::__cxx11::string::_M_assign(local_4908);
        local_48e8[0]._0_4_ = primspec->_specifier;
        local_4d20._0_8_ = linb::any::vtable_for_type<tinyusdz::SkelRoot>()::table;
        pGVar9 = (GeomMesh *)operator_new(0xfe0);
        SkelRoot::SkelRoot((SkelRoot *)pGVar9,(SkelRoot *)local_49a8);
        local_4d30.dynamic = pGVar9;
        Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d30);
        ::std::__cxx11::string::_M_assign(local_4a88);
        __return_storage_ptr__->has_value_ = true;
        Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
        Prim::~Prim((Prim *)local_4cf8);
        if ((pointer)local_4d20._0_8_ != (pointer)0x0) {
          (**(code **)((long)&((string *)(local_4d20._0_8_ + 8))->field_2 + 8))(&local_4d30);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"ReconstructPrimFromPrimSpec",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
        poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x49f);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"Failed to reconstruct Prim from PrimSpec ",0x29);
        poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4cf8,(primspec->_typeName)._M_dataplus._M_p,
                             (primspec->_typeName)._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," elementName: ",0xe);
        poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,(primspec->_name)._M_dataplus._M_p,
                             (primspec->_name)._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)err,(ulong)local_4d30.dynamic);
          if ((GeomMesh *)local_4d30.dynamic != (GeomMesh *)local_4d20) {
            operator_delete(local_4d30.dynamic,(ulong)((long)(OpType *)local_4d20._0_8_ + 1));
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
        ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
        __return_storage_ptr__->has_value_ = false;
        memset(&__return_storage_ptr__->contained,0,0x350);
      }
      SkelRoot::~SkelRoot((SkelRoot *)local_49a8);
      return extraout_RAX_14;
    }
    local_4998._M_dataplus._M_p._0_4_ = 0x6c656b53;
    local_4998._M_dataplus._M_p._4_1_ = 'e';
    local_4998._M_dataplus._M_p._5_1_ = 't';
    local_4998._M_dataplus._M_p._6_1_ = 'o';
    local_4998._M_dataplus._M_p._7_1_ = 'n';
    local_49a8._8_8_ = (pointer)0x8;
    local_4998._M_string_length._0_1_ = '\0';
    if (*(long *)(psVar1->_M_dataplus)._M_p == 0x6e6f74656c656b53) {
      Skeleton::Skeleton((Skeleton *)local_49a8);
      local_4cf8[0] = false;
      bVar7 = tinyusdz::prim::ReconstructPrim<tinyusdz::Skeleton>
                        (primspec,(Skeleton *)local_49a8,warn,err,
                         (PrimReconstructOptions *)local_4cf8);
      if (bVar7) {
        PrimMetas::operator=((PrimMetas *)local_31a0,&primspec->_metas);
        ::std::__cxx11::string::_M_assign(local_4908);
        local_48e8[0]._0_4_ = primspec->_specifier;
        local_4d20._0_8_ = linb::any::vtable_for_type<tinyusdz::Skeleton>()::table;
        pGVar9 = (GeomMesh *)operator_new(0x1c30);
        Skeleton::Skeleton((Skeleton *)pGVar9,(Skeleton *)local_49a8);
        local_4d30.dynamic = pGVar9;
        Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d30);
        ::std::__cxx11::string::_M_assign(local_4a88);
        __return_storage_ptr__->has_value_ = true;
        Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
        Prim::~Prim((Prim *)local_4cf8);
        if ((pointer)local_4d20._0_8_ != (pointer)0x0) {
          (**(code **)((long)&((string *)(local_4d20._0_8_ + 8))->field_2 + 8))(&local_4d30);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"ReconstructPrimFromPrimSpec",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
        poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x4a0);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"Failed to reconstruct Prim from PrimSpec ",0x29);
        poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4cf8,(primspec->_typeName)._M_dataplus._M_p,
                             (primspec->_typeName)._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," elementName: ",0xe);
        poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,(primspec->_name)._M_dataplus._M_p,
                             (primspec->_name)._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)err,(ulong)local_4d30.dynamic);
          if ((GeomMesh *)local_4d30.dynamic != (GeomMesh *)local_4d20) {
            operator_delete(local_4d30.dynamic,(ulong)((long)(OpType *)local_4d20._0_8_ + 1));
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
        ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
        __return_storage_ptr__->has_value_ = false;
        memset(&__return_storage_ptr__->contained,0,0x350);
      }
      Skeleton::~Skeleton((Skeleton *)local_49a8);
      return extraout_RAX_17;
    }
  }
  local_4998._M_dataplus._M_p._0_4_ = 0x6c656b53;
  local_4998._M_dataplus._M_p._4_1_ = 'A';
  local_4998._M_dataplus._M_p._5_1_ = 'n';
  local_4998._M_dataplus._M_p._6_1_ = 'i';
  local_4998._M_dataplus._M_p._7_1_ = 'm';
  local_4998._M_string_length._0_1_ = 'a';
  local_4998._M_string_length._1_1_ = 't';
  local_4998._M_string_length._2_1_ = 'i';
  local_4998._M_string_length._3_1_ = 'o';
  local_4998._M_string_length._4_1_ = 'n';
  local_49a8._8_8_ = (pointer)0xd;
  local_4998._M_string_length._5_1_ = '\0';
  if ((bVar5) &&
     (plVar4 = (long *)(psVar1->_M_dataplus)._M_p,
     *(long *)((long)plVar4 + 5) == 0x6e6f6974616d696e && *plVar4 == 0x6d696e416c656b53)) {
    SkelAnimation::SkelAnimation((SkelAnimation *)local_49a8);
    local_4cf8[0] = false;
    bVar7 = tinyusdz::prim::ReconstructPrim<tinyusdz::SkelAnimation>
                      (primspec,(SkelAnimation *)local_49a8,warn,err,
                       (PrimReconstructOptions *)local_4cf8);
    if (bVar7) {
      PrimMetas::operator=(local_3a58,&primspec->_metas);
      ::std::__cxx11::string::_M_assign((string *)local_49a8);
      local_4998.field_2._M_allocated_capacity._0_4_ = primspec->_specifier;
      local_4d20._0_8_ = linb::any::vtable_for_type<tinyusdz::SkelAnimation>()::table;
      pGVar9 = (GeomMesh *)operator_new(0x1378);
      SkelAnimation::SkelAnimation((SkelAnimation *)pGVar9,(SkelAnimation *)local_49a8);
      local_4d30.dynamic = pGVar9;
      Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d30);
      ::std::__cxx11::string::_M_assign(local_4a88);
      __return_storage_ptr__->has_value_ = true;
      Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
      Prim::~Prim((Prim *)local_4cf8);
      if ((pointer)local_4d20._0_8_ != (pointer)0x0) {
        (**(code **)((long)&((string *)(local_4d20._0_8_ + 8))->field_2 + 8))(&local_4d30);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                 ,0x55);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,"ReconstructPrimFromPrimSpec",0x1b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
      poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x4a1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,"Failed to reconstruct Prim from PrimSpec ",0x29);
      poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4cf8,(primspec->_typeName)._M_dataplus._M_p,
                           (primspec->_typeName)._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," elementName: ",0xe);
      poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,(primspec->_name)._M_dataplus._M_p,
                           (primspec->_name)._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)err,(ulong)local_4d30.dynamic);
        if ((GeomMesh *)local_4d30.dynamic != (GeomMesh *)local_4d20) {
          operator_delete(local_4d30.dynamic,(ulong)((long)(OpType *)local_4d20._0_8_ + 1));
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
      ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
      __return_storage_ptr__->has_value_ = false;
      memset(&__return_storage_ptr__->contained,0,0x350);
    }
    SkelAnimation::~SkelAnimation((SkelAnimation *)local_49a8);
    poVar10 = extraout_RAX_16;
  }
  else {
    local_4998._M_dataplus._M_p._0_4_ = 0x6e656c42;
    local_4998._M_dataplus._M_p._4_1_ = 'd';
    local_4998._M_dataplus._M_p._5_1_ = 'S';
    local_4998._M_dataplus._M_p._6_1_ = 'h';
    local_4998._M_dataplus._M_p._7_1_ = 'a';
    local_4998._M_string_length._0_1_ = 'p';
    local_4998._M_string_length._1_1_ = 'e';
    local_49a8._8_8_ = (pointer)0xa;
    local_4998._M_string_length._2_1_ = '\0';
    if ((sVar2 == 10) &&
       (plVar4 = (long *)(psVar1->_M_dataplus)._M_p,
       (short)plVar4[1] == 0x6570 && *plVar4 == 0x616853646e656c42)) {
      BlendShape::BlendShape((BlendShape *)local_49a8);
      local_4cf8[0] = false;
      bVar7 = tinyusdz::prim::ReconstructPrim<tinyusdz::BlendShape>
                        (primspec,(BlendShape *)local_49a8,warn,err,
                         (PrimReconstructOptions *)local_4cf8);
      if (bVar7) {
        PrimMetas::operator=((PrimMetas *)local_41e8,&primspec->_metas);
        ::std::__cxx11::string::_M_assign((string *)local_49a8);
        local_4998.field_2._M_allocated_capacity._0_4_ = primspec->_specifier;
        local_4d20._0_8_ = linb::any::vtable_for_type<tinyusdz::BlendShape>()::table;
        pGVar9 = (GeomMesh *)operator_new(0xbe8);
        BlendShape::BlendShape((BlendShape *)pGVar9,(BlendShape *)local_49a8);
        local_4d30.dynamic = pGVar9;
        Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d30);
        ::std::__cxx11::string::_M_assign(local_4a88);
        __return_storage_ptr__->has_value_ = true;
        Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
        Prim::~Prim((Prim *)local_4cf8);
        if ((pointer)local_4d20._0_8_ != (pointer)0x0) {
          (**(code **)((long)&((string *)(local_4d20._0_8_ + 8))->field_2 + 8))(&local_4d30);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"ReconstructPrimFromPrimSpec",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
        poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x4a2);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"Failed to reconstruct Prim from PrimSpec ",0x29);
        poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4cf8,(primspec->_typeName)._M_dataplus._M_p,
                             (primspec->_typeName)._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," elementName: ",0xe);
        poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,(primspec->_name)._M_dataplus._M_p,
                             (primspec->_name)._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)err,(ulong)local_4d30.dynamic);
          if ((GeomMesh *)local_4d30.dynamic != (GeomMesh *)local_4d20) {
            operator_delete(local_4d30.dynamic,(ulong)((long)(OpType *)local_4d20._0_8_ + 1));
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
        ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
        __return_storage_ptr__->has_value_ = false;
        memset(&__return_storage_ptr__->contained,0,0x350);
      }
      BlendShape::~BlendShape((BlendShape *)local_49a8);
      poVar10 = extraout_RAX_18;
    }
    else {
      local_4998._M_dataplus._M_p._0_4_ = 0x64616853;
      local_4998._M_dataplus._M_p._4_1_ = 'e';
      local_4998._M_dataplus._M_p._5_1_ = 'r';
      local_49a8._8_8_ = (pointer)0x6;
      local_4998._M_dataplus._M_p._6_1_ = '\0';
      if ((bVar7) &&
         (piVar3 = (int *)(psVar1->_M_dataplus)._M_p,
         (short)piVar3[1] == 0x7265 && *piVar3 == 0x64616853)) {
        Shader::Shader((Shader *)local_49a8);
        local_4cf8[0] = false;
        bVar7 = tinyusdz::prim::ReconstructPrim<tinyusdz::Shader>
                          (primspec,(Shader *)local_49a8,warn,err,
                           (PrimReconstructOptions *)local_4cf8);
        if (bVar7) {
          PrimMetas::operator=((PrimMetas *)local_4978,&primspec->_metas);
          ::std::__cxx11::string::_M_assign((string *)local_49a8);
          local_4998.field_2._M_allocated_capacity._0_4_ = primspec->_specifier;
          local_4d20._0_8_ = linb::any::vtable_for_type<tinyusdz::Shader>()::table;
          linb::any::do_construct<tinyusdz::Shader_const&,tinyusdz::Shader>
                    ((any *)&local_4d30,(Shader *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d30);
          ::std::__cxx11::string::_M_assign(local_4a88);
          __return_storage_ptr__->has_value_ = true;
          Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if ((pointer)local_4d20._0_8_ != (pointer)0x0) {
            (**(code **)((long)&((string *)(local_4d20._0_8_ + 8))->field_2 + 8))(&local_4d30);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"ReconstructPrimFromPrimSpec",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
          poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x4a3);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"Failed to reconstruct Prim from PrimSpec ",0x29);
          poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4cf8,(primspec->_typeName)._M_dataplus._M_p,
                               (primspec->_typeName)._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," elementName: ",0xe);
          poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,(primspec->_name)._M_dataplus._M_p,
                               (primspec->_name)._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append((char *)err,(ulong)local_4d30.dynamic);
            if ((GeomMesh *)local_4d30.dynamic != (GeomMesh *)local_4d20) {
              operator_delete(local_4d30.dynamic,(ulong)((long)(OpType *)local_4d20._0_8_ + 1));
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        Shader::~Shader((Shader *)local_49a8);
        poVar10 = extraout_RAX_19;
      }
      else {
        local_4998._M_dataplus._M_p._0_4_ = 0x6574614d;
        local_4998._M_dataplus._M_p._4_1_ = 'r';
        local_4998._M_dataplus._M_p._5_1_ = 'i';
        local_4998._M_dataplus._M_p._6_1_ = 'a';
        local_4998._M_dataplus._M_p._7_1_ = 'l';
        local_49a8._8_8_ = (pointer)0x8;
        local_4998._M_string_length._0_1_ = '\0';
        if ((bVar6) && (*(long *)(psVar1->_M_dataplus)._M_p == 0x6c6169726574614d)) {
          Material::Material((Material *)local_49a8);
          local_4cf8[0] = false;
          bVar7 = tinyusdz::prim::ReconstructPrim<tinyusdz::Material>
                            (primspec,(Material *)local_49a8,warn,err,
                             (PrimReconstructOptions *)local_4cf8);
          if (bVar7) {
            PrimMetas::operator=((PrimMetas *)local_4978,&primspec->_metas);
            ::std::__cxx11::string::_M_assign((string *)local_49a8);
            local_4998.field_2._M_allocated_capacity._0_4_ = primspec->_specifier;
            local_4d20._0_8_ = linb::any::vtable_for_type<tinyusdz::Material>()::table;
            linb::any::do_construct<tinyusdz::Material_const&,tinyusdz::Material>
                      ((any *)&local_4d30,(Material *)local_49a8);
            Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d30);
            ::std::__cxx11::string::_M_assign(local_4a88);
            __return_storage_ptr__->has_value_ = true;
            Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
            Prim::~Prim((Prim *)local_4cf8);
            if ((pointer)local_4d20._0_8_ != (pointer)0x0) {
              (**(code **)((long)&((string *)(local_4d20._0_8_ + 8))->field_2 + 8))(&local_4d30);
            }
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4cf8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                       ,0x55);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4cf8,"ReconstructPrimFromPrimSpec",0x1b);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
            poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x4a4);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4cf8,"Failed to reconstruct Prim from PrimSpec ",0x29);
            poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4cf8,(primspec->_typeName)._M_dataplus._M_p,
                                 (primspec->_typeName)._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," elementName: ",0xe);
            poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(primspec->_name)._M_dataplus._M_p,
                                 (primspec->_name)._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::_M_append((char *)err,(ulong)local_4d30.dynamic);
              if ((GeomMesh *)local_4d30.dynamic != (GeomMesh *)local_4d20) {
                operator_delete(local_4d30.dynamic,(ulong)((long)(OpType *)local_4d20._0_8_ + 1));
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
            ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
            __return_storage_ptr__->has_value_ = false;
            memset(&__return_storage_ptr__->contained,0,0x350);
          }
          Material::~Material((Material *)local_49a8);
          poVar10 = extraout_RAX_21;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_49a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_49a8,"[warn]",6);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_49a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_49a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_49a8,"ReconstructPrimFromPrimSpec",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_49a8,"():",3);
          poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_49a8,0x4a5);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_49a8,"TODO or unsupported prim type: ",0x1f);
          poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_49a8,(primspec->_typeName)._M_dataplus._M_p,
                               (primspec->_typeName)._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
          if (warn != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append((char *)warn,CONCAT71(local_4cf8._1_7_,local_4cf8[0]))
            ;
            if ((undefined1 *)CONCAT71(local_4cf8._1_7_,local_4cf8[0]) != local_4cf8 + 0x10) {
              operator_delete((undefined1 *)CONCAT71(local_4cf8._1_7_,local_4cf8[0]),
                              local_4cf8._16_8_ + 1);
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_49a8);
          ::std::ios_base::~ios_base(local_4938);
          __return_storage_ptr__->has_value_ = false;
          poVar10 = (optional<tinyusdz::Prim> *)memset(&__return_storage_ptr__->contained,0,0x350);
        }
      }
    }
  }
  return poVar10;
}

Assistant:

static nonstd::optional<Prim> ReconstructPrimFromPrimSpec(
    const PrimSpec &primspec, std::string *warn, std::string *err) {
  (void)warn;

  // TODO:
  // - propertyNames()
  // - primChildrenNames()

#define RECONSTRUCT_PRIM(__primty)                                       \
  if (primspec.typeName() == value::TypeTraits<__primty>::type_name()) { \
    __primty typed_prim;                                                 \
    if (!prim::ReconstructPrim(primspec, &typed_prim, warn, err)) {      \
      PUSH_ERROR("Failed to reconstruct Prim from PrimSpec "             \
                 << primspec.typeName()                                  \
                 << " elementName: " << primspec.name());                \
      return nonstd::nullopt;                                            \
    }                                                                    \
    typed_prim.meta = primspec.metas();                                  \
    typed_prim.name = primspec.name();                                   \
    typed_prim.spec = primspec.specifier();                              \
    /*typed_prim.propertyNames() = properties; */                        \
    /*typed_prim.primChildrenNames() = primChildren;*/                   \
    value::Value primdata = typed_prim;                                  \
    Prim prim(primspec.name(), primdata);                                \
    prim.prim_type_name() = primspec.typeName();                         \
    /* also add primChildren to Prim */                                  \
    /* prim.metas().primChildren = primChildren; */                      \
    return std::move(prim);                                              \
  }